

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_save_select_show_hash_option.hpp
# Opt level: O2

void __thiscall
PatchSaveSelectShowHashOption::alter_rom(PatchSaveSelectShowHashOption *this,ROM *rom)

{
  allocator<char> local_69;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Hash",&local_69);
  Symbols::bytes_for_symbols
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,&local_38);
  md::ROM::set_bytes(rom,0x29a20,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  md::ROM::set_word(rom,0x29a4b,0x100);
  md::ROM::set_word(rom,0x294e8,0xffff);
  md::ROM::set_byte(rom,0x29a4d,(uint8_t)(this->_hash_sentence)._M_string_length);
  Symbols::bytes_for_symbols
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,
             &this->_hash_sentence);
  md::ROM::set_bytes(rom,0x29a4e,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void alter_rom(md::ROM& rom)
    {
        // Replace "Copy" string by "Hash"
        rom.set_bytes(0x29A20, Symbols::bytes_for_symbols("Hash"));

        // Replace "Massan" by an empty string, and make this string the one shown for every map in the game
        rom.set_word(0x29A4B, 0x0100);
        rom.set_word(0x294E8, 0xFFFF);

        // Put hash sentence as string 4D
        rom.set_byte(0x29A4D, (uint8_t)_hash_sentence.size());
        rom.set_bytes(0x29A4E, Symbols::bytes_for_symbols(_hash_sentence));
    }